

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O0

void __thiscall Fl_Menu_Button_Type::ideal_size(Fl_Menu_Button_Type *this,int *w,int *h)

{
  Fl_Fontsize FVar1;
  Fl_Fontsize FVar2;
  int *h_local;
  int *w_local;
  Fl_Menu_Button_Type *this_local;
  
  Fl_Widget_Type::ideal_size((Fl_Widget_Type *)this,w,h);
  FVar1 = Fl_Widget::labelsize((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  FVar2 = Fl_Widget::labelsize((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  *w = (FVar1 - 3U & 0xfffffffe) * 2 + FVar2 + -4 + *w;
  *h = (*h / 5) * 5;
  if (*h < 0xf) {
    *h = 0xf;
  }
  if (*w < *h + 0xf) {
    *w = *h + 0xf;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Widget_Type::ideal_size(w, h);
    w += 2 * ((o->labelsize() - 3) & ~1) + o->labelsize() - 4;
    h = (h / 5) * 5;
    if (h < 15) h = 15;
    if (w < (15 + h)) w = 15 + h;
  }